

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cpp
# Opt level: O2

Status __thiscall
ot::commissioner::persistent_storage::Registry::DeleteBorderRouterById
          (Registry *this,BorderRouterId *aRouterId)

{
  bool bVar1;
  char cVar2;
  Status SVar3;
  int iVar4;
  vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
  routers;
  Network brNetwork;
  Network current;
  BorderRouter br;
  BorderRouter pred;
  
  BorderRouter::BorderRouter(&br);
  Network::Network(&current);
  routers.
  super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  routers.
  super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  routers.
  super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  BorderRouter::BorderRouter(&pred);
  iVar4 = (*this->mStorage->_vptr_PersistentStorage[0xf])(this->mStorage,aRouterId,&br);
  cVar2 = (char)iVar4;
  SVar3 = (cVar2 != '\0') << 2;
  if (cVar2 == '\x01') {
    SVar3 = kNotFound;
  }
  if (cVar2 != '\0') goto LAB_00181863;
  SVar3 = GetCurrentNetwork(this,&current);
  if ((SVar3 == kSuccess) && (current.mId.mId != 0xffffffff)) {
    Network::Network(&brNetwork);
    iVar4 = (*this->mStorage->_vptr_PersistentStorage[0xf])(this->mStorage,aRouterId,&br);
    cVar2 = (char)iVar4;
    SVar3 = (cVar2 != '\0') << 2;
    if (cVar2 == '\x01') {
      SVar3 = kNotFound;
    }
    if (cVar2 == '\0') {
      iVar4 = (*this->mStorage->_vptr_PersistentStorage[0xe])
                        (this->mStorage,&br.mNetworkId,&brNetwork);
      cVar2 = (char)iVar4;
      SVar3 = (cVar2 != '\0') << 2;
      if (cVar2 == '\x01') {
        SVar3 = kNotFound;
      }
      if (cVar2 != '\0') goto LAB_0018192a;
      if (brNetwork.mXpan == current.mXpan) {
        pred.mNetworkId = brNetwork.mId;
        iVar4 = (*this->mStorage->_vptr_PersistentStorage[0x17])(this->mStorage,&pred,&routers);
        cVar2 = (char)iVar4;
        SVar3 = (cVar2 != '\0') << 2;
        if (cVar2 == '\x01') {
          SVar3 = kNotFound;
        }
        if (cVar2 == '\0') {
          if (1 < (ulong)(((long)routers.
                                 super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)routers.
                                super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                                ._M_impl.super__Vector_impl_data._M_start) / 0x188))
          goto LAB_00181a85;
          SVar3 = kRestricted;
        }
        goto LAB_0018192a;
      }
LAB_00181a85:
      bVar1 = true;
      SVar3 = kSuccess;
    }
    else {
LAB_0018192a:
      bVar1 = false;
    }
    Network::~Network(&brNetwork);
    if (!bVar1) goto LAB_00181863;
  }
  iVar4 = (*this->mStorage->_vptr_PersistentStorage[0xb])(this->mStorage,aRouterId);
  SVar3 = ((char)iVar4 != '\0') << 2;
  if ((char)iVar4 == '\x01') {
    SVar3 = kNotFound;
  }
  if (br.mNetworkId.mId != 0xffffffff) {
    std::
    vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
    ::clear(&routers);
    pred.mNetworkId = br.mNetworkId;
    iVar4 = (*this->mStorage->_vptr_PersistentStorage[0x17])(this->mStorage,&pred,&routers);
    if ((char)iVar4 == '\x01') {
      Network::Network(&brNetwork);
      iVar4 = (*this->mStorage->_vptr_PersistentStorage[0xe])
                        (this->mStorage,&br.mNetworkId,&brNetwork);
      cVar2 = (char)iVar4;
      SVar3 = (cVar2 != '\0') << 2;
      if (cVar2 == '\x01') {
        SVar3 = kNotFound;
      }
      if (cVar2 == '\0') {
        iVar4 = (*this->mStorage->_vptr_PersistentStorage[10])(this->mStorage,&br.mNetworkId);
        cVar2 = (char)iVar4;
        SVar3 = (cVar2 != '\0') << 2;
        if (cVar2 == '\x01') {
          SVar3 = kNotFound;
        }
        if (cVar2 == '\0') {
          SVar3 = DropDomainIfEmpty(this,&brNetwork.mDomainId);
        }
      }
      Network::~Network(&brNetwork);
    }
    else {
      SVar3 = ((char)iVar4 != '\0') << 2;
    }
  }
LAB_00181863:
  BorderRouter::~BorderRouter(&pred);
  std::
  vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
  ::~vector(&routers);
  Network::~Network(&current);
  BorderRouter::~BorderRouter(&br);
  return SVar3;
}

Assistant:

Registry::Status Registry::DeleteBorderRouterById(const BorderRouterId &aRouterId)
{
    Registry::Status          status;
    BorderRouter              br;
    Network                   current;
    std::vector<BorderRouter> routers;
    BorderRouter              pred;

    VerifyOrExit((status = MapStatus(mStorage->Get(aRouterId, br))) == Registry::Status::kSuccess);

    status = GetCurrentNetwork(current);
    if (status == Registry::Status::kSuccess && (current.mId.mId != EMPTY_ID))
    {
        Network brNetwork;
        // Check we don't delete the last border router in the current network
        VerifyOrExit((status = MapStatus(mStorage->Get(aRouterId, br))) == Registry::Status::kSuccess);
        VerifyOrExit((status = MapStatus(mStorage->Get(br.mNetworkId, brNetwork))) == Registry::Status::kSuccess);
        if (brNetwork.mXpan == current.mXpan)
        {
            pred.mNetworkId = brNetwork.mId;
            VerifyOrExit((status = MapStatus(mStorage->Lookup(pred, routers))) == Registry::Status::kSuccess);
            VerifyOrExit(routers.size() > 1, status = Registry::Status::kRestricted);
        }
    }

    status = MapStatus(mStorage->Del(aRouterId));

    if (br.mNetworkId.mId != EMPTY_ID)
    {
        // Was it the last in the network?
        routers.clear();
        pred.mNetworkId = br.mNetworkId;
        status          = MapStatus(mStorage->Lookup(pred, routers));
        if (status == Registry::Status::kNotFound)
        {
            Network nwk;
            VerifyOrExit((status = MapStatus(mStorage->Get(br.mNetworkId, nwk))) == Registry::Status::kSuccess);
            VerifyOrExit((status = MapStatus(mStorage->Del(br.mNetworkId))) == Registry::Status::kSuccess);

            VerifyOrExit((status = DropDomainIfEmpty(nwk.mDomainId)) == Registry::Status::kSuccess);
        }
    }
exit:
    return status;
}